

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::rc::Texture2D::sample4(Texture2D *this,Vec4 *output,Vec2 *packetTexcoords,float lodBias)

{
  undefined8 uVar1;
  ulong *puVar2;
  ulong *puVar3;
  int fragNdx;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  Vec2 dFdy1;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  undefined1 local_58 [16];
  _func_int **local_48;
  deUint32 dStack_40;
  int iStack_3c;
  
  if ((this->m_view).m_numLevels < 1) {
    local_58 = ZEXT416(0);
  }
  else {
    uVar1 = *(undefined8 *)(((this->m_view).m_levels)->m_size).m_data;
    local_58._0_4_ = (undefined4)(int)uVar1;
    local_58._4_4_ = (undefined4)(int)((ulong)uVar1 >> 0x20);
    local_58._8_8_ = 0;
  }
  tcu::operator-(packetTexcoords + 1,packetTexcoords);
  tcu::operator-(packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-(packetTexcoords + 2,packetTexcoords);
  tcu::operator-(packetTexcoords + 3,packetTexcoords + 1);
  for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
    puVar2 = &local_68;
    if (uVar4 < 2) {
      puVar2 = &local_60;
    }
    puVar3 = (ulong *)&stack0xffffffffffffffc8;
    if ((uVar4 & 1) == 0) {
      puVar3 = &local_70;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *puVar2;
    auVar7._0_8_ = *puVar2 ^ 0x8000000080000000;
    auVar7._8_4_ = 0x80000000;
    auVar7._12_4_ = 0x80000000;
    auVar8 = maxps(auVar7,auVar8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *puVar3;
    auVar9._0_8_ = *puVar3 ^ 0x8000000080000000;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar10 = maxps(auVar9,auVar10);
    uVar5 = -(uint)(auVar10._0_4_ <= auVar8._0_4_);
    uVar6 = -(uint)(auVar10._4_4_ <= auVar8._4_4_);
    fVar11 = (float)(~uVar5 & (uint)auVar10._0_4_ | (uint)auVar8._0_4_ & uVar5) *
             (float)local_58._0_4_;
    fVar12 = (float)(~uVar6 & (uint)auVar10._4_4_ | (uint)auVar8._4_4_ & uVar6) *
             (float)local_58._4_4_;
    uVar5 = -(uint)(fVar12 <= fVar11);
    fVar11 = deFloatLog2((float)(~uVar5 & (uint)fVar12 | (uint)fVar11 & uVar5));
    sample((Texture2D *)&stack0xffffffffffffffb8,packetTexcoords[uVar4].m_data[0],
           packetTexcoords[uVar4].m_data[1],fVar11 + lodBias);
    *(_func_int ***)output->m_data = local_48;
    output->m_data[2] = (float)dStack_40;
    output->m_data[3] = (float)iStack_3c;
    output = output + 1;
  }
  return;
}

Assistant:

void Texture2D::sample4 (tcu::Vec4 output[4], const tcu::Vec2 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec2 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec2 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec2 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec2 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), lod);
	}
}